

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O3

void google::protobuf::compiler::anon_unknown_0::CheckSingleAnnotation
               (string_view expected_file,string_view expected_text,string_view file_content,
               Annotation *annotation)

{
  internal iVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  AssertHelper local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = expected_file._M_str;
  local_40._M_len = expected_file._M_len;
  plVar4 = (long *)file_content._M_len;
  local_50._M_str = expected_text._M_str;
  plVar2 = (long *)expected_text._M_len;
  local_50._M_len = (size_t)plVar2;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (local_70,"expected_file","annotation.source_file()",&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(annotation->field_0)._impl_.source_file_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
             ));
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xa7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)local_60._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_len + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_78.data_._0_4_ = (annotation->field_0)._impl_.begin_;
  local_60._M_len = (size_t)plVar4;
  testing::internal::CmpHelperGE<unsigned_long,int>
            (local_70,"file_content.size()","annotation.begin()",&local_60._M_len,(int *)&local_78);
  iVar1 = local_70[0];
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xa8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)local_60._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_len + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if (iVar1 != (internal)0x0) {
    local_78.data_._0_4_ = (annotation->field_0)._impl_.end_;
    local_60._M_len = (size_t)plVar4;
    testing::internal::CmpHelperGE<unsigned_long,int>
              (local_70,"file_content.size()","annotation.end()",&local_60._M_len,(int *)&local_78);
    iVar1 = local_70[0];
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar5 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xa9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((long *)local_60._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_60._M_len + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    if (iVar1 != (internal)0x0) {
      local_60._M_len = CONCAT44(local_60._M_len._4_4_,(annotation->field_0)._impl_.begin_);
      local_78.data_._0_4_ = (annotation->field_0)._impl_.end_;
      testing::internal::CmpHelperLE<int,int>
                (local_70,"annotation.begin()","annotation.end()",(int *)&local_60,(int *)&local_78)
      ;
      iVar1 = local_70[0];
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (local_68->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xaa,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((long *)local_60._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_60._M_len + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      if (iVar1 != (internal)0x0) {
        local_78.data_._0_4_ =
             (annotation->field_0)._impl_.end_ - (annotation->field_0)._impl_.begin_;
        local_60._M_len = (size_t)plVar2;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  (local_70,"expected_text.size()","annotation.end() - annotation.begin()",
                   &local_60._M_len,(int *)&local_78);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = (local_68->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xab,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((long *)local_60._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_60._M_len + 8))();
          }
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
        plVar3 = (long *)(long)(annotation->field_0)._impl_.begin_;
        if (plVar4 < plVar3) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     plVar3,plVar4);
        }
        local_60._M_len = (size_t)plVar2;
        if ((long *)((long)plVar4 - (long)plVar3) < plVar2) {
          local_60._M_len = (size_t)((long)plVar4 - (long)plVar3);
        }
        local_60._M_str = file_content._M_str + (long)plVar3;
        testing::internal::
        CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (local_70,"expected_text",
                   "file_content.substr(annotation.begin(), expected_text.size())",&local_50,
                   &local_60);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = (local_68->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xad,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((long *)local_60._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_60._M_len + 8))();
          }
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
      }
    }
  }
  return;
}

Assistant:

void CheckSingleAnnotation(absl::string_view expected_file,
                           absl::string_view expected_text,
                           absl::string_view file_content,
                           const GeneratedCodeInfo::Annotation& annotation) {
  EXPECT_EQ(expected_file, annotation.source_file());
  ASSERT_GE(file_content.size(), annotation.begin());
  ASSERT_GE(file_content.size(), annotation.end());
  ASSERT_LE(annotation.begin(), annotation.end());
  EXPECT_EQ(expected_text.size(), annotation.end() - annotation.begin());
  EXPECT_EQ(expected_text,
            file_content.substr(annotation.begin(), expected_text.size()));
}